

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileNameSanitizerFactory.cpp
# Opt level: O0

bool ApprovalTests::FileNameSanitizerFactory::isForbidden(char c)

{
  int iVar1;
  long lVar2;
  char in_DIL;
  allocator local_2;
  char local_1;
  
  local_1 = in_DIL;
  if (isForbidden(char)::forbiddenChars_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&isForbidden(char)::forbiddenChars_abi_cxx11_);
    if (iVar1 != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&isForbidden(char)::forbiddenChars_abi_cxx11_,"\\/:?\"<>|\' ",&local_2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2);
      __cxa_atexit(::std::__cxx11::string::~string,&isForbidden(char)::forbiddenChars_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&isForbidden(char)::forbiddenChars_abi_cxx11_);
    }
  }
  lVar2 = ::std::__cxx11::string::find(-0x78,(ulong)(uint)(int)local_1);
  return lVar2 != -1;
}

Assistant:

bool FileNameSanitizerFactory::isForbidden(char c)
    {
        static std::string forbiddenChars("\\/:?\"<>|' ");
        return std::string::npos != forbiddenChars.find(c);
    }